

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

bool __thiscall
duckdb::GlobMultiFileList::ExpandPathInternal
          (GlobMultiFileList *this,idx_t *current_path,vector<duckdb::OpenFileInfo,_true> *result)

{
  ulong uVar1;
  long lVar2;
  pointer pOVar3;
  pointer pOVar4;
  FileSystem *this_00;
  const_reference pattern;
  ulong uVar5;
  ulong uVar6;
  vector<duckdb::OpenFileInfo,_true> glob_files;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_48;
  
  uVar1 = *current_path;
  uVar6 = ((long)(this->super_MultiFileList).paths.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->super_MultiFileList).paths.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar1 < uVar6) {
    this_00 = FileSystem::GetFileSystem(this->context);
    pattern = vector<duckdb::OpenFileInfo,_true>::operator[]
                        (&(this->super_MultiFileList).paths,*current_path);
    FileSystem::GlobFiles
              ((vector<duckdb::OpenFileInfo,_true> *)&local_48,this_00,&pattern->path,this->context,
               (this->super_MultiFileList).glob_options);
    pOVar4 = local_48.
             super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pOVar3 = local_48.
             super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar5 = ((long)local_48.
                     super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::OpenFileInfo*,std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_48.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::OpenFileInfo*,std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pOVar3,pOVar4);
    }
    ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::OpenFileInfo*,std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>>>
              ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)result,
               (result->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               local_48.
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_48.
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    *current_path = *current_path + 1;
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_48);
  }
  return uVar1 < uVar6;
}

Assistant:

bool GlobMultiFileList::ExpandPathInternal(idx_t &current_path, vector<OpenFileInfo> &result) const {
	if (current_path >= paths.size()) {
		return false;
	}

	auto &fs = FileSystem::GetFileSystem(context);
	auto glob_files = fs.GlobFiles(paths[current_path].path, context, glob_options);
	std::sort(glob_files.begin(), glob_files.end());
	result.insert(result.end(), glob_files.begin(), glob_files.end());

	current_path++;
	return true;
}